

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::EntityMarking::Encode(EntityMarking *this,KDataStream *stream)

{
  KUINT16 i;
  long lVar1;
  
  KDataStream::Write(stream,this->m_ui8EntityMarkingCharacterSet);
  lVar1 = 0;
  do {
    KDataStream::Write(stream,this->m_sEntityMarkingString[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xb);
  return;
}

Assistant:

void EntityMarking::Encode( KDataStream & stream ) const
{
    stream << m_ui8EntityMarkingCharacterSet;

    for( KUINT16 i = 0; i < 11; ++i )
    {
        stream << m_sEntityMarkingString[i];
    }
}